

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall Imf_2_5::DwaCompressor::Classifier::Classifier(Classifier *this,char **ptr,int size)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  size_t sVar7;
  InputExc *pIVar8;
  CompressorScheme CVar9;
  char *pcVar10;
  char suffix [257];
  long *local_158 [2];
  long local_148 [2];
  char local_138 [264];
  
  (this->_suffix)._M_dataplus._M_p = (pointer)&(this->_suffix).field_2;
  (this->_suffix)._M_string_length = 0;
  (this->_suffix).field_2._M_local_buf[0] = '\0';
  if (0 < size) {
    pcVar10 = local_138;
    memset(pcVar10,0,0x101);
    iVar6 = 0xff;
    if (size < 0xff) {
      iVar6 = size;
    }
    pcVar5 = *ptr;
    do {
      *ptr = pcVar5 + 1;
      cVar1 = *pcVar5;
      *pcVar10 = cVar1;
      if (cVar1 == '\0') break;
      pcVar10 = pcVar10 + 1;
      bVar4 = 0 < iVar6;
      iVar6 = iVar6 + -1;
      pcVar5 = pcVar5 + 1;
    } while (bVar4);
    local_158[0] = local_148;
    sVar7 = strlen(local_138);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,local_138,local_138 + sVar7)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_158);
    if (local_158[0] != local_148) {
      operator_delete(local_158[0],local_148[0] + 1);
    }
    if ((this->_suffix)._M_string_length + 3 <= (ulong)(uint)size) {
      pbVar3 = (byte *)*ptr;
      *ptr = (char *)(pbVar3 + 1);
      bVar2 = *pbVar3;
      this->_cscIdx = (int)(char)(((char)bVar2 >> 4) - 1);
      if ((byte)((char)bVar2 >> 4) < 4) {
        CVar9 = bVar2 >> 2 & NUM_COMPRESSOR_SCHEMES;
        this->_scheme = CVar9;
        if (CVar9 == NUM_COMPRESSOR_SCHEMES) {
          pcVar10 = "Error uncompressing DWA data (corrupt scheme rule).";
        }
        else {
          this->_caseInsensitive = (bool)(bVar2 & 1);
          *ptr = (char *)(pbVar3 + 2);
          if (pbVar3[1] < NUM_PIXELTYPES) {
            this->_type = (uint)pbVar3[1];
            return;
          }
          pcVar10 = "Error uncompressing DWA data (corrupt rule).";
        }
      }
      else {
        pcVar10 = "Error uncompressing DWA data (corrupt cscIdx rule).";
      }
      pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar8,pcVar10);
      __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
  }
  pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(pIVar8,"Error uncompressing DWA data (truncated rule).");
  __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

Classifier (const char *&ptr, int size)
    {
        if (size <= 0) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");
            
        {
            // maximum length of string plus one byte for terminating NULL
            char suffix[Name::SIZE+1];
            memset (suffix, 0, Name::SIZE+1);
            Xdr::read<CharPtrIO> (ptr, std::min(size, Name::SIZE-1), suffix);
            _suffix = std::string(suffix);
        }

        if (static_cast<size_t>(size) < _suffix.length() + 1 + 2*Xdr::size<char>()) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated rule).");

        char value;
        Xdr::read<CharPtrIO> (ptr, value);

        _cscIdx = (int)(value >> 4) - 1;
        if (_cscIdx < -1 || _cscIdx >= 3) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt cscIdx rule).");

        _scheme = (CompressorScheme)((value >> 2) & 3);
        if (_scheme < 0 || _scheme >= NUM_COMPRESSOR_SCHEMES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt scheme rule).");

        _caseInsensitive = (value & 1 ? true : false);

        Xdr::read<CharPtrIO> (ptr, value);
        if (value < 0 || value >= NUM_PIXELTYPES) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt rule).");
        _type = (PixelType)value;
    }